

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall duckdb::DatabaseInstance::CreateMainDatabase(DatabaseInstance *this)

{
  DBConfigOptions *options_00;
  StorageOptions options_01;
  type fs;
  pointer this_00;
  type context;
  AttachedDatabase *pAVar1;
  optional_ptr<duckdb::ClientContext,_true> context_00;
  optional_ptr<duckdb::AttachedDatabase,_true> initial_database;
  Connection con;
  AttachInfo info;
  AttachOptions options;
  optional_ptr<duckdb::AttachedDatabase,_true> local_1c0;
  Connection local_1b8;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined1 local_170 [16];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  __buckets_ptr local_120;
  size_type local_118;
  undefined1 local_110 [16];
  float local_100;
  undefined1 local_f8 [16];
  OnCreateConflict local_e8;
  AttachOptions local_e0;
  
  local_160._M_p = (pointer)&local_150;
  local_170[8] = ATTACH_INFO;
  local_170._0_8_ = &PTR__AttachInfo_0178a918;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_140._M_p = (pointer)&local_130;
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120 = (__buckets_ptr)(local_f8 + 8);
  local_118 = 1;
  local_110 = (undefined1  [16])0x0;
  local_100 = 1.0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = ERROR_ON_CONFLICT;
  fs = unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>
       ::operator*(&this->db_file_system);
  options_00 = &(this->config).options;
  AttachedDatabase::ExtractDatabaseName
            ((string *)&local_e0,&options_00->database_path,(FileSystem *)fs);
  ::std::__cxx11::string::operator=((string *)&local_160,(string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::_M_assign((string *)&local_140);
  local_1c0.ptr = (AttachedDatabase *)0x0;
  Connection::Connection(&local_1b8,this);
  Connection::BeginTransaction(&local_1b8);
  AttachOptions::AttachOptions(&local_e0,options_00);
  this_00 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>
            ::operator->(&this->db_manager);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_1b8.context);
  local_1c0 = DatabaseManager::AttachDatabase(this_00,context,(AttachInfo *)local_170,&local_e0);
  pAVar1 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&local_1c0);
  pAVar1->is_initial_database = true;
  pAVar1 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&local_1c0);
  context_00.ptr = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_1b8.context);
  local_178 = 0;
  local_198 = 0xffffffff;
  uStack_194 = 0xffffffff;
  uStack_190 = 0xffffffff;
  uStack_18c = 0xffffffff;
  local_188 = 0xffffffff;
  uStack_184 = 0xffffffff;
  uStack_180 = 0xffffffff;
  uStack_17c = 0xffffffff;
  options_01.row_group_size.index = 0xffffffffffffffff;
  options_01.block_alloc_size.index = 0xffffffffffffffff;
  options_01.storage_version.index = 0xffffffffffffffff;
  options_01.block_header_size.index = 0xffffffffffffffff;
  options_01._32_8_ = 0;
  AttachedDatabase::Initialize(pAVar1,context_00,options_01);
  Connection::Commit(&local_1b8);
  AttachOptions::~AttachOptions(&local_e0);
  Connection::~Connection(&local_1b8);
  AttachInfo::~AttachInfo((AttachInfo *)local_170);
  return;
}

Assistant:

void DatabaseInstance::CreateMainDatabase() {
	AttachInfo info;
	info.name = AttachedDatabase::ExtractDatabaseName(config.options.database_path, GetFileSystem());
	info.path = config.options.database_path;

	optional_ptr<AttachedDatabase> initial_database;
	Connection con(*this);
	con.BeginTransaction();
	AttachOptions options(config.options);
	initial_database = db_manager->AttachDatabase(*con.context, info, options);

	initial_database->SetInitialDatabase();
	initial_database->Initialize(*con.context);
	con.Commit();
}